

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::ReaderMgr::getLastExtEntityInfo(ReaderMgr *this,LastExtEntityInfo *lastInfo)

{
  XMLReader *pXVar1;
  XMLEntityDecl *theEntity;
  XMLEntityDecl *local_10;
  
  if ((this->fReaderStack == (RefStackOf<xercesc_4_0::ReaderMgr::ReaderData> *)0x0) ||
     (this->fCurReader == (XMLReader *)0x0)) {
    lastInfo->systemId = L"";
    lastInfo->publicId = L"";
    lastInfo->lineNumber = 0;
    lastInfo->colNumber = 0;
  }
  else {
    pXVar1 = getLastExtEntity(this,&local_10);
    lastInfo->systemId = pXVar1->fSystemId;
    lastInfo->publicId = pXVar1->fPublicId;
    lastInfo->lineNumber = pXVar1->fCurLine;
    lastInfo->colNumber = pXVar1->fCurCol;
  }
  return;
}

Assistant:

void ReaderMgr::getLastExtEntityInfo(LastExtEntityInfo& lastInfo) const
{
    //
    //  If the reader stack never got created or we've not managed to open any
    //  main entity yet, then we can't give this information.
    //
    if (!fReaderStack || !fCurReader)
    {
        lastInfo.systemId = XMLUni::fgZeroLenString;
        lastInfo.publicId = XMLUni::fgZeroLenString;
        lastInfo.lineNumber = 0;
        lastInfo.colNumber = 0;
        return;
    }

    // We have at least one entity so get the data
    const XMLEntityDecl*    theEntity;
    const XMLReader*        theReader = getLastExtEntity(theEntity);

    // Fill in the info structure with the reader we found
    lastInfo.systemId = theReader->getSystemId();
    lastInfo.publicId = theReader->getPublicId();
    lastInfo.lineNumber = theReader->getLineNumber();
    lastInfo.colNumber = theReader->getColumnNumber();
}